

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O3

void __thiscall Assimp::ColladaParser::ReadEffectLibrary(ColladaParser *this)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  mapped_type *pmVar4;
  undefined4 extraout_var_01;
  string id;
  key_type local_418;
  Effect local_3f8;
  
  iVar1 = (*this->mReader->_vptr_IIrrXMLReader[0xf])();
  if (((char)iVar1 == '\0') &&
     (iVar1 = (*this->mReader->_vptr_IIrrXMLReader[2])(), (char)iVar1 != '\0')) {
    do {
      iVar1 = (*this->mReader->_vptr_IIrrXMLReader[3])();
      iVar2 = (*this->mReader->_vptr_IIrrXMLReader[3])();
      if (iVar1 == 1) {
        if (iVar2 != 1) {
          __assert_fail("mReader->getNodeType() == irr::io::EXN_ELEMENT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Collada/ColladaParser.h"
                        ,0x178,"bool Assimp::ColladaParser::IsElement(const char *) const");
        }
        iVar1 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
        iVar1 = strcmp((char *)CONCAT44(extraout_var,iVar1),"effect");
        if (iVar1 == 0) {
          uVar3 = GetAttribute(this,"id");
          iVar1 = (*this->mReader->_vptr_IIrrXMLReader[6])(this->mReader,(ulong)uVar3);
          std::__cxx11::string::string
                    ((string *)&local_418,(char *)CONCAT44(extraout_var_00,iVar1),
                     (allocator *)&local_3f8);
          local_3f8.mShadeType = Shade_Phong;
          local_3f8.mEmissive.r = 0.0;
          local_3f8.mEmissive.g = 0.0;
          local_3f8.mEmissive.b = 0.0;
          local_3f8.mEmissive.a = 1.0;
          local_3f8.mAmbient.r = 0.1;
          local_3f8.mAmbient.g = 0.1;
          local_3f8.mAmbient.b = 0.1;
          local_3f8.mAmbient.a = 1.0;
          local_3f8.mDiffuse.r = 0.6;
          local_3f8.mDiffuse.g = 0.6;
          local_3f8.mDiffuse.b = 0.6;
          local_3f8.mDiffuse.a = 1.0;
          local_3f8.mSpecular.r = 0.4;
          local_3f8.mSpecular.g = 0.4;
          local_3f8.mSpecular.b = 0.4;
          local_3f8.mSpecular.a = 1.0;
          local_3f8.mTransparent.r = 0.0;
          local_3f8.mTransparent.g = 0.0;
          local_3f8.mTransparent.b = 0.0;
          local_3f8.mTransparent.a = 1.0;
          local_3f8.mReflective.r = 0.0;
          local_3f8.mReflective.g = 0.0;
          local_3f8.mReflective.b = 0.0;
          local_3f8.mReflective.a = 0.0;
          local_3f8.mTexEmissive.mName._M_dataplus._M_p =
               (pointer)&local_3f8.mTexEmissive.mName.field_2;
          local_3f8.mTexEmissive.mName._M_string_length = 0;
          local_3f8.mTexEmissive.mName.field_2._M_local_buf[0] = '\0';
          local_3f8.mTexEmissive.mWrapU = true;
          local_3f8.mTexEmissive.mWrapV = true;
          local_3f8.mTexEmissive.mTransform.mTranslation._2_6_ = 0;
          local_3f8.mTexEmissive.mMirrorU = false;
          local_3f8.mTexEmissive.mMirrorV = false;
          local_3f8.mTexEmissive.mOp = aiTextureOp_Multiply;
          local_3f8.mTexEmissive.mTransform.mTranslation.x._0_2_ = 0;
          local_3f8.mTexEmissive.mTransform.mScaling.x = 1.0;
          local_3f8.mTexEmissive.mTransform.mScaling.y = 1.0;
          local_3f8.mTexEmissive.mTransform.mRotation = 0.0;
          local_3f8.mTexEmissive.mUVChannel._M_dataplus._M_p =
               (pointer)&local_3f8.mTexEmissive.mUVChannel.field_2;
          local_3f8.mTexEmissive.mUVChannel._M_string_length = 0;
          local_3f8.mTexEmissive.mUVChannel.field_2._M_local_buf[0] = '\0';
          local_3f8.mTexEmissive.mUVId = 0xffffffff;
          local_3f8.mTexEmissive.mWeighting = 1.0;
          local_3f8.mTexEmissive.mMixWithPrevious = 1.0;
          local_3f8.mTexAmbient.mName._M_dataplus._M_p =
               (pointer)&local_3f8.mTexAmbient.mName.field_2;
          local_3f8.mTexAmbient.mName._M_string_length = 0;
          local_3f8.mTexAmbient.mName.field_2._M_local_buf[0] = '\0';
          local_3f8.mTexAmbient.mWrapU = true;
          local_3f8.mTexAmbient.mWrapV = true;
          local_3f8.mTexAmbient.mTransform.mTranslation._2_6_ = 0;
          local_3f8.mTexAmbient.mMirrorU = false;
          local_3f8.mTexAmbient.mMirrorV = false;
          local_3f8.mTexAmbient.mOp = aiTextureOp_Multiply;
          local_3f8.mTexAmbient.mTransform.mTranslation.x._0_2_ = 0;
          local_3f8.mTexAmbient.mTransform.mScaling.x = 1.0;
          local_3f8.mTexAmbient.mTransform.mScaling.y = 1.0;
          local_3f8.mTexAmbient.mTransform.mRotation = 0.0;
          local_3f8.mTexAmbient.mUVChannel._M_dataplus._M_p =
               (pointer)&local_3f8.mTexAmbient.mUVChannel.field_2;
          local_3f8.mTexAmbient.mUVChannel._M_string_length = 0;
          local_3f8.mTexAmbient.mUVChannel.field_2._M_local_buf[0] = '\0';
          local_3f8.mTexAmbient.mUVId = 0xffffffff;
          local_3f8.mTexAmbient.mWeighting = 1.0;
          local_3f8.mTexAmbient.mMixWithPrevious = 1.0;
          local_3f8.mTexDiffuse.mName._M_dataplus._M_p =
               (pointer)&local_3f8.mTexDiffuse.mName.field_2;
          local_3f8.mTexDiffuse.mName._M_string_length = 0;
          local_3f8.mTexDiffuse.mName.field_2._M_local_buf[0] = '\0';
          local_3f8.mTexDiffuse.mWrapU = true;
          local_3f8.mTexDiffuse.mWrapV = true;
          local_3f8.mTexDiffuse.mTransform.mTranslation._2_6_ = 0;
          local_3f8.mTexDiffuse.mMirrorU = false;
          local_3f8.mTexDiffuse.mMirrorV = false;
          local_3f8.mTexDiffuse.mOp = aiTextureOp_Multiply;
          local_3f8.mTexDiffuse.mTransform.mTranslation.x._0_2_ = 0;
          local_3f8.mTexDiffuse.mTransform.mScaling.x = 1.0;
          local_3f8.mTexDiffuse.mTransform.mScaling.y = 1.0;
          local_3f8.mTexDiffuse.mTransform.mRotation = 0.0;
          local_3f8.mTexDiffuse.mUVChannel._M_dataplus._M_p =
               (pointer)&local_3f8.mTexDiffuse.mUVChannel.field_2;
          local_3f8.mTexDiffuse.mUVChannel._M_string_length = 0;
          local_3f8.mTexDiffuse.mUVChannel.field_2._M_local_buf[0] = '\0';
          local_3f8.mTexDiffuse.mUVId = 0xffffffff;
          local_3f8.mTexDiffuse.mWeighting = 1.0;
          local_3f8.mTexDiffuse.mMixWithPrevious = 1.0;
          local_3f8.mTexSpecular.mName._M_dataplus._M_p =
               (pointer)&local_3f8.mTexSpecular.mName.field_2;
          local_3f8.mTexSpecular.mName._M_string_length = 0;
          local_3f8.mTexSpecular.mName.field_2._M_local_buf[0] = '\0';
          local_3f8.mTexSpecular.mWrapU = true;
          local_3f8.mTexSpecular.mWrapV = true;
          local_3f8.mTexSpecular.mTransform.mTranslation._2_6_ = 0;
          local_3f8.mTexSpecular.mMirrorU = false;
          local_3f8.mTexSpecular.mMirrorV = false;
          local_3f8.mTexSpecular.mOp = aiTextureOp_Multiply;
          local_3f8.mTexSpecular.mTransform.mTranslation.x._0_2_ = 0;
          local_3f8.mTexSpecular.mTransform.mScaling.x = 1.0;
          local_3f8.mTexSpecular.mTransform.mScaling.y = 1.0;
          local_3f8.mTexSpecular.mTransform.mRotation = 0.0;
          local_3f8.mTexSpecular.mUVChannel._M_dataplus._M_p =
               (pointer)&local_3f8.mTexSpecular.mUVChannel.field_2;
          local_3f8.mTexSpecular.mUVChannel._M_string_length = 0;
          local_3f8.mTexSpecular.mUVChannel.field_2._M_local_buf[0] = '\0';
          local_3f8.mTexSpecular.mUVId = 0xffffffff;
          local_3f8.mTexSpecular.mWeighting = 1.0;
          local_3f8.mTexSpecular.mMixWithPrevious = 1.0;
          local_3f8.mTexTransparent.mName._M_dataplus._M_p =
               (pointer)&local_3f8.mTexTransparent.mName.field_2;
          local_3f8.mTexTransparent.mName._M_string_length = 0;
          local_3f8.mTexTransparent.mName.field_2._M_local_buf[0] = '\0';
          local_3f8.mTexTransparent.mWrapU = true;
          local_3f8.mTexTransparent.mWrapV = true;
          local_3f8.mTexTransparent.mTransform.mTranslation._2_6_ = 0;
          local_3f8.mTexTransparent.mMirrorU = false;
          local_3f8.mTexTransparent.mMirrorV = false;
          local_3f8.mTexTransparent.mOp = aiTextureOp_Multiply;
          local_3f8.mTexTransparent.mTransform.mTranslation.x._0_2_ = 0;
          local_3f8.mTexTransparent.mTransform.mScaling.x = 1.0;
          local_3f8.mTexTransparent.mTransform.mScaling.y = 1.0;
          local_3f8.mTexTransparent.mTransform.mRotation = 0.0;
          local_3f8.mTexTransparent.mUVChannel._M_dataplus._M_p =
               (pointer)&local_3f8.mTexTransparent.mUVChannel.field_2;
          local_3f8.mTexTransparent.mUVChannel._M_string_length = 0;
          local_3f8.mTexTransparent.mUVChannel.field_2._M_local_buf[0] = '\0';
          local_3f8.mTexTransparent.mUVId = 0xffffffff;
          local_3f8.mTexTransparent.mWeighting = 1.0;
          local_3f8.mTexTransparent.mMixWithPrevious = 1.0;
          local_3f8.mTexBump.mName._M_dataplus._M_p = (pointer)&local_3f8.mTexBump.mName.field_2;
          local_3f8.mTexBump.mName._M_string_length = 0;
          local_3f8.mTexBump.mName.field_2._M_local_buf[0] = '\0';
          local_3f8.mTexBump.mWrapU = true;
          local_3f8.mTexBump.mWrapV = true;
          local_3f8.mTexBump.mTransform.mTranslation._2_6_ = 0;
          local_3f8.mTexBump.mMirrorU = false;
          local_3f8.mTexBump.mMirrorV = false;
          local_3f8.mTexBump.mOp = aiTextureOp_Multiply;
          local_3f8.mTexBump.mTransform.mTranslation.x._0_2_ = 0;
          local_3f8.mTexBump.mTransform.mScaling.x = 1.0;
          local_3f8.mTexBump.mTransform.mScaling.y = 1.0;
          local_3f8.mTexBump.mTransform.mRotation = 0.0;
          local_3f8.mTexBump.mUVChannel._M_dataplus._M_p =
               (pointer)&local_3f8.mTexBump.mUVChannel.field_2;
          local_3f8.mTexBump.mUVChannel._M_string_length = 0;
          local_3f8.mTexBump.mUVChannel.field_2._M_local_buf[0] = '\0';
          local_3f8.mTexBump.mUVId = 0xffffffff;
          local_3f8.mTexBump.mWeighting = 1.0;
          local_3f8.mTexBump.mMixWithPrevious = 1.0;
          local_3f8.mTexReflective.mName._M_dataplus._M_p =
               (pointer)&local_3f8.mTexReflective.mName.field_2;
          local_3f8.mTexReflective.mName._M_string_length = 0;
          local_3f8.mTexReflective.mName.field_2._M_local_buf[0] = '\0';
          local_3f8.mTexReflective.mWrapU = true;
          local_3f8.mTexReflective.mWrapV = true;
          local_3f8.mTexReflective.mTransform.mTranslation._2_6_ = 0;
          local_3f8.mTexReflective.mMirrorU = false;
          local_3f8.mTexReflective.mMirrorV = false;
          local_3f8.mTexReflective.mOp = aiTextureOp_Multiply;
          local_3f8.mTexReflective.mTransform.mTranslation.x._0_2_ = 0;
          local_3f8.mTexReflective.mTransform.mScaling.x = 1.0;
          local_3f8.mTexReflective.mTransform.mScaling.y = 1.0;
          local_3f8.mTexReflective.mTransform.mRotation = 0.0;
          local_3f8.mTexReflective.mUVChannel._M_dataplus._M_p =
               (pointer)&local_3f8.mTexReflective.mUVChannel.field_2;
          local_3f8.mTexReflective.mUVChannel._M_string_length = 0;
          local_3f8.mTexReflective.mUVChannel.field_2._M_local_buf[0] = '\0';
          local_3f8.mTexReflective.mUVId = 0xffffffff;
          local_3f8.mTexReflective.mWeighting = 1.0;
          local_3f8.mTexReflective.mMixWithPrevious = 1.0;
          local_3f8.mShininess = 10.0;
          local_3f8.mRefractIndex = 1.0;
          local_3f8.mReflectivity = 0.0;
          local_3f8.mTransparency = 1.0;
          local_3f8.mHasTransparency = false;
          local_3f8.mRGBTransparency = false;
          local_3f8.mInvertTransparency = false;
          local_3f8.mParams._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          local_3f8.mParams._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          local_3f8.mParams._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               &local_3f8.mParams._M_t._M_impl.super__Rb_tree_header._M_header;
          local_3f8.mParams._M_t._M_impl.super__Rb_tree_header._M_node_count._0_7_ = 0;
          local_3f8._959_4_ = 0;
          local_3f8.mParams._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               local_3f8.mParams._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          pmVar4 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Effect,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Effect>_>_>
                   ::operator[](&this->mEffectLibrary,&local_418);
          Collada::Effect::operator=(pmVar4,&local_3f8);
          Collada::Effect::~Effect(&local_3f8);
          pmVar4 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Effect,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Effect>_>_>
                   ::operator[](&this->mEffectLibrary,&local_418);
          ReadEffect(this,pmVar4);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_418._M_dataplus._M_p != &local_418.field_2) {
            operator_delete(local_418._M_dataplus._M_p);
          }
        }
        else {
          SkipElement(this);
        }
      }
      else if (iVar2 == 2) {
        iVar1 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
        iVar1 = strcmp((char *)CONCAT44(extraout_var_01,iVar1),"library_effects");
        if (iVar1 == 0) {
          return;
        }
        local_3f8._0_8_ = &local_3f8.mEmissive.a;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_3f8,"Expected end of <library_effects> element.","");
        ThrowException(this,(string *)&local_3f8);
      }
      iVar1 = (*this->mReader->_vptr_IIrrXMLReader[2])();
    } while ((char)iVar1 != '\0');
  }
  return;
}

Assistant:

void ColladaParser::ReadEffectLibrary()
{
    if (mReader->isEmptyElement()) {
        return;
    }

    while (mReader->read())
    {
        if (mReader->getNodeType() == irr::io::EXN_ELEMENT) {
            if (IsElement("effect"))
            {
                // read ID. Do I have to repeat my ranting about "optional" attributes?
                int attrID = GetAttribute("id");
                std::string id = mReader->getAttributeValue(attrID);

                // create an entry and store it in the library under its ID
                mEffectLibrary[id] = Effect();
                // read on from there
                ReadEffect(mEffectLibrary[id]);
            }
            else
            {
                // ignore the rest
                SkipElement();
            }
        }
        else if (mReader->getNodeType() == irr::io::EXN_ELEMENT_END) {
            if (strcmp(mReader->getNodeName(), "library_effects") != 0)
                ThrowException("Expected end of <library_effects> element.");

            break;
        }
    }
}